

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void nni_list_insert_after(nni_list *list,void *item,void *after)

{
  long *plVar1;
  size_t sVar2;
  long lVar3;
  
  sVar2 = list->ll_offset;
  plVar1 = (long *)((long)item + sVar2);
  if ((*(long *)((long)item + sVar2) != 0) || (plVar1[1] != 0)) {
    nni_panic("inserting node already on a list or not inited");
  }
  plVar1[1] = (long)after + sVar2;
  lVar3 = *(long *)((long)after + sVar2);
  *plVar1 = lVar3;
  *(long **)(lVar3 + 8) = plVar1;
  *(long **)plVar1[1] = plVar1;
  return;
}

Assistant:

void
nni_list_insert_after(nni_list *list, void *item, void *after)
{
	nni_list_node *node  = NODE(list, item);
	nni_list_node *where = NODE(list, after);

	if ((node->ln_next != NULL) || (node->ln_prev != NULL)) {
		nni_panic("inserting node already on a list or not inited");
	}
	node->ln_prev          = where;
	node->ln_next          = where->ln_next;
	node->ln_next->ln_prev = node;
	node->ln_prev->ln_next = node;
}